

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void set_type_qual(c2m_ctx_t c2m_ctx,node_t_conflict r,type_qual *tq,type_mode tmode)

{
  node_t_conflict n;
  char *pcVar1;
  anon_union_16_10_0af5b411_for_u *paVar2;
  pos_t pVar3;
  
  paVar2 = &r->u;
  do {
    n = (paVar2->ops).head;
    if (n == (node_t_conflict)0x0) {
      return;
    }
    switch(n->code) {
    case N_CONST:
      *(byte *)tq = *(byte *)tq | 1;
      break;
    case N_RESTRICT:
      *(byte *)tq = *(byte *)tq | 2;
      if ((tmode != TM_UNDEF) && (tmode != TM_PTR)) {
        pVar3 = get_node_pos(c2m_ctx,n);
        pcVar1 = "restrict requires a pointer";
        goto LAB_0015aee4;
      }
      break;
    case N_VOLATILE:
      *(byte *)tq = *(byte *)tq | 4;
      break;
    case N_ATOMIC:
      *(byte *)tq = *(byte *)tq | 8;
      if (tmode == TM_FUNC) {
        pVar3 = get_node_pos(c2m_ctx,n);
        pcVar1 = "_Atomic qualifying function";
      }
      else {
        if (tmode != TM_ARR) break;
        pVar3 = get_node_pos(c2m_ctx,n);
        pcVar1 = "_Atomic qualifying array";
      }
LAB_0015aee4:
      error(c2m_ctx,pcVar1,pVar3.fname,pVar3._8_8_);
    }
    paVar2 = (anon_union_16_10_0af5b411_for_u *)&(n->op_link).next;
  } while( true );
}

Assistant:

static void set_type_qual (c2m_ctx_t c2m_ctx, node_t r, struct type_qual *tq,
                           enum type_mode tmode) {
  for (node_t n = NL_HEAD (r->u.ops); n != NULL; n = NL_NEXT (n)) switch (n->code) {
      /* Type qualifiers: */
    case N_CONST: tq->const_p = TRUE; break;
    case N_RESTRICT:
      tq->restrict_p = TRUE;
      if (tmode != TM_PTR && tmode != TM_UNDEF)
        error (c2m_ctx, POS (n), "restrict requires a pointer");
      break;
    case N_VOLATILE: tq->volatile_p = TRUE; break;
    case N_ATOMIC:
      tq->atomic_p = TRUE;
      if (tmode == TM_ARR)
        error (c2m_ctx, POS (n), "_Atomic qualifying array");
      else if (tmode == TM_FUNC)
        error (c2m_ctx, POS (n), "_Atomic qualifying function");
      break;
    default: break; /* Ignore */
    }
}